

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue,uint16_t fadeInMS)

{
  FACTAudioCategory *pFVar1;
  FACTInstanceRPCData *pFVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  FACTAudioEngine *pFVar6;
  FACTVariation *pFVar7;
  FACTSoundBank *pFVar8;
  FACTVariationTable *pFVar9;
  char *pcVar10;
  FACTSound *pFVar11;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  FACTSoundInstance *pFVar15;
  FACTTrackInstance *pFVar16;
  FACTEventInstance *pFVar17;
  FACTTrack *pFVar18;
  ulong uVar19;
  uint16_t uVar20;
  FACTCue *pFVar21;
  byte bVar22;
  float *pfVar23;
  uint32_t *puVar24;
  ulong uVar25;
  ushort *puVar26;
  ulong uVar27;
  long lVar28;
  FACTCue *pCue;
  ulong uVar29;
  FACTSound *pFVar30;
  LinkedList *pLVar31;
  ulong uVar32;
  FACTEvent *pFVar33;
  FACTWaveBank *pWaveBank;
  float fVar34;
  float next;
  float local_40;
  float local_3c;
  ulong local_38;
  
  pFVar30 = (FACTSound *)(cue->field_7).variation;
  if ((cue->data->flags & 4) == 0) {
    if (pFVar30->flags == '\x03') {
      pFVar6 = cue->parentBank->parentEngine;
      uVar20 = pFVar30->category;
      if ((pFVar6->variables[(short)uVar20].accessibility & 4) == 0) {
        FACTAudioEngine_GetGlobalVariable(pFVar6,uVar20,&local_40);
      }
      else {
        FACTCue_GetVariable(cue,uVar20,&local_40);
      }
      uVar5 = ((cue->field_7).variation)->entryCount;
      if (uVar5 == 0) {
        uVar27 = 0;
      }
      else {
        pfVar23 = &((cue->field_7).variation)->entries->maxWeight;
        uVar29 = 0;
        do {
          if ((local_40 <= *pfVar23) && (uVar27 = uVar29, pfVar23[-1] <= local_40)) break;
          uVar29 = uVar29 + 1;
          pfVar23 = pfVar23 + 4;
          uVar27 = (ulong)uVar5;
        } while (uVar5 != uVar29);
      }
      uVar13 = (uint)uVar27;
      if (uVar13 == uVar5) {
        return '\x01';
      }
    }
    else {
      uVar5 = *(uint16_t *)((long)&pFVar30->volume + 2);
      if (uVar5 == 0) {
        local_3c = 0.0;
      }
      else {
        local_3c = 0.0;
        lVar28 = 0;
        do {
          local_3c = local_3c +
                     (*(float *)((long)&(*(FACTVariation **)&pFVar30->pitch)->maxWeight + lVar28) -
                     *(float *)((long)&(*(FACTVariation **)&pFVar30->pitch)->minWeight + lVar28));
          lVar28 = lVar28 + 0x10;
        } while ((ulong)uVar5 * 0x10 != lVar28);
      }
      uVar13 = stb_rand();
      local_40 = (float)((double)uVar13 * 2.3283064365386963e-10) * local_3c;
      uVar5 = ((cue->field_7).variation)->entryCount;
      uVar27 = (ulong)uVar5;
      uVar13 = 1;
      if (uVar5 == 0) {
        uVar13 = (uint)uVar5;
      }
      uVar13 = uVar13 - 1;
      lVar28 = (ulong)uVar5 * 0x10 + -8;
      fVar34 = local_3c;
      do {
        if ((long)uVar27 < 2) goto LAB_0010de9d;
        uVar27 = uVar27 - 1;
        pFVar7 = ((cue->field_7).variation)->entries;
        fVar34 = fVar34 - (*(float *)((long)&pFVar7->field_0 + lVar28) -
                          *(float *)((long)pFVar7 + lVar28 + -4));
        lVar28 = lVar28 + -0x10;
      } while (local_40 <= fVar34);
      uVar13 = (uint)uVar27;
    }
LAB_0010de9d:
    pFVar8 = cue->parentBank;
    pFVar9 = (cue->field_7).variation;
    if (pFVar9->isComplex == '\0') {
      pLVar31 = pFVar8->parentEngine->wbList;
      if (pLVar31 == (LinkedList *)0x0) {
        pWaveBank = (FACTWaveBank *)0x0;
      }
      else {
        pcVar10 = pFVar8->wavebankNames[pFVar9->entries[(int)uVar13].field_0.simple.wavebank];
        do {
          pWaveBank = (FACTWaveBank *)pLVar31->entry;
          iVar14 = SDL_strcmp(pcVar10,pWaveBank->name);
          if (iVar14 == 0) break;
          pLVar31 = pLVar31->next;
        } while (pLVar31 != (LinkedList *)0x0);
      }
      pFVar30 = (FACTSound *)0x0;
      FACTWaveBank_Prepare
                (pWaveBank,((cue->field_7).variation)->entries[(int)uVar13].field_0.simple.track,0,0
                 ,'\0',&cue->simpleWave);
      cue->simpleWave->parentCue = cue;
    }
    else if (pFVar8->soundCount == 0) {
      pFVar30 = (FACTSound *)0x0;
    }
    else {
      puVar24 = pFVar8->soundCodes;
      pFVar30 = (FACTSound *)0x0;
      lVar28 = 0;
      do {
        if (pFVar9->entries[(int)uVar13].field_0.soundCode == *puVar24) {
          pFVar30 = (FACTSound *)((long)pFVar8->sounds - lVar28);
          break;
        }
        lVar28 = lVar28 + -0x28;
        puVar24 = puVar24 + 1;
      } while ((ulong)pFVar8->soundCount * 0x28 + lVar28 != 0);
    }
  }
  if (pFVar30 == (FACTSound *)0x0) {
    return '\x01';
  }
  uVar5 = pFVar30->category;
  if ((ulong)uVar5 == 0xffff) goto LAB_0010e0fe;
  pFVar1 = cue->parentBank->parentEngine->categories + uVar5;
  if (pFVar1->instanceLimit <= pFVar1->instanceCount) {
    if (pFVar1->maxInstanceBehavior < 5) {
      pFVar21 = cue->parentBank->cueList;
      switch(pFVar1->maxInstanceBehavior) {
      case '\0':
        cue->state = cue->state & 0xffffff87 | 0x20;
        return '\0';
      case '\x01':
        if (pFVar21 == (FACTCue *)0x0) goto LAB_0010e0cb;
        do {
          if (((pFVar21 != cue) && (pFVar21->playingSound != (FACTSoundInstance *)0x0)) &&
             ((pFVar21->playingSound->sound->category == uVar5 &&
              (pCue = pFVar21, (pFVar21->state & 0x30) == 0)))) break;
          pFVar21 = pFVar21->next;
          pCue = (FACTCue *)0x0;
        } while (pFVar21 != (FACTCue *)0x0);
        break;
      case '\x02':
        if (pFVar21 == (FACTCue *)0x0) goto LAB_0010e0cb;
        do {
          if ((((pFVar21 != cue) && (pFVar21->playingSound != (FACTSoundInstance *)0x0)) &&
              (pFVar21->playingSound->sound->category == uVar5)) &&
             (pCue = pFVar21, (pFVar21->state & 0x30) == 0)) break;
          pFVar21 = pFVar21->next;
          pCue = (FACTCue *)0x0;
        } while (pFVar21 != (FACTCue *)0x0);
        break;
      case '\x03':
        if (pFVar21 == (FACTCue *)0x0) goto LAB_0010e0cb;
        pCue = (FACTCue *)0x0;
        do {
          if (((pFVar21 != cue) && (pFVar21->playingSound != (FACTSoundInstance *)0x0)) &&
             ((pFVar21->playingSound->sound->category == uVar5 && ((pFVar21->state & 0x30) == 0))))
          {
            pCue = pFVar21;
          }
          pFVar21 = pFVar21->next;
        } while (pFVar21 != (FACTCue *)0x0);
        break;
      case '\x04':
        if (pFVar21 == (FACTCue *)0x0) goto LAB_0010e0cb;
        bVar22 = 0xff;
        pCue = (FACTCue *)0x0;
        do {
          if ((((pFVar21 != cue) && (pFVar21->playingSound != (FACTSoundInstance *)0x0)) &&
              (pFVar11 = pFVar21->playingSound->sound, pFVar11->category == uVar5)) &&
             ((bVar4 = pFVar11->priority, bVar4 < bVar22 && ((pFVar21->state & 0x30) == 0)))) {
            pCue = pFVar21;
            bVar22 = bVar4;
          }
          pFVar21 = pFVar21->next;
        } while (pFVar21 != (FACTCue *)0x0);
      }
    }
    else {
LAB_0010e0cb:
      pCue = (FACTCue *)0x0;
    }
    if (pCue != (FACTCue *)0x0) {
      fadeInMS = pFVar1->fadeInMS;
      if (pCue->playingSound == (FACTSoundInstance *)0x0) {
        FACTCue_Stop(pCue,0);
      }
      else {
        FACT_INTERNAL_BeginFadeOut(pCue->playingSound,pFVar1->fadeOutMS);
      }
    }
  }
  pFVar1->instanceCount = pFVar1->instanceCount + '\x01';
LAB_0010e0fe:
  pFVar15 = (FACTSoundInstance *)(*cue->parentBank->parentEngine->pMalloc)(0x38);
  pFVar15->parentCue = cue;
  pFVar15->sound = pFVar30;
  (pFVar15->rpcData).rpcFilterQFactor = 1.0;
  (pFVar15->rpcData).rpcVolume = 0.0;
  (pFVar15->rpcData).rpcPitch = 0.0;
  (pFVar15->rpcData).rpcReverbSend = 0.0;
  (pFVar15->rpcData).rpcFilterFreq = 1.0;
  pFVar15->fadeType = fadeInMS != 0;
  if (fadeInMS == 0) {
    uVar12 = 0;
    fadeInMS = 0;
  }
  else {
    uVar12 = FAudio_timems();
  }
  pFVar15->fadeStart = uVar12;
  pFVar15->fadeTarget = fadeInMS;
  pFVar16 = (FACTTrackInstance *)
            (*cue->parentBank->parentEngine->pMalloc)((ulong)pFVar15->sound->trackCount * 0x68);
  pFVar15->tracks = pFVar16;
  pFVar30 = pFVar15->sound;
  if (pFVar30->trackCount != '\0') {
    uVar27 = 0;
    do {
      pFVar16 = pFVar15->tracks;
      pFVar2 = &pFVar16[uVar27].rpcData;
      pFVar2->rpcVolume = 0.0;
      pFVar2->rpcPitch = 0.0;
      pFVar2->rpcReverbSend = 0.0;
      pFVar2->rpcFilterFreq = 1.0;
      pFVar16[uVar27].evtVolume = 0.0;
      *(undefined8 *)&pFVar16[uVar27].rpcData.rpcFilterQFactor = 0x3f800000;
      pFVar16[uVar27].activeWave.wave = (FACTWave *)0x0;
      pFVar16[uVar27].activeWave.baseVolume = 0.0;
      pFVar16[uVar27].activeWave.basePitch = 0;
      pFVar16[uVar27].activeWave.baseQFactor = 1.0;
      pFVar16[uVar27].activeWave.baseFrequency = 1.0;
      pFVar16[uVar27].upcomingWave.wave = (FACTWave *)0x0;
      pFVar16[uVar27].upcomingWave.baseVolume = 0.0;
      pFVar16[uVar27].upcomingWave.basePitch = 0;
      pFVar16[uVar27].upcomingWave.baseQFactor = 1.0;
      pFVar16[uVar27].upcomingWave.baseFrequency = 1.0;
      local_38 = uVar27;
      pFVar17 = (FACTEventInstance *)
                (*cue->parentBank->parentEngine->pMalloc)
                          ((ulong)pFVar30->tracks[uVar27].eventCount * 0xc);
      uVar29 = local_38;
      pFVar15->tracks[uVar27].events = pFVar17;
      pFVar18 = pFVar15->sound->tracks;
      if (pFVar18[uVar27].eventCount != '\0') {
        uVar32 = 0;
        do {
          pFVar33 = pFVar18[uVar29].events;
          pFVar17 = pFVar15->tracks[uVar27].events;
          pFVar17[uVar32].timestamp = (uint)pFVar33[uVar32].timestamp;
          pFVar17[uVar32].loopCount = 0;
          pFVar17[uVar32].finished = '\0';
          pFVar17[uVar32].field_3.value = 0.0;
          uVar5 = pFVar33[uVar32].type;
          if (uVar5 < 0x13) {
            if ((0x5aU >> (uVar5 & 0x1f) & 1) == 0) {
              if ((0x30000U >> (uVar5 & 0x1f) & 1) == 0) {
                if (uVar5 != 0x12) goto LAB_0010e3d5;
                pFVar16 = pFVar15->tracks;
                uVar20 = pFVar15->sound->tracks[uVar29].events[uVar32].field_3.wave.angle;
              }
              else {
                pFVar16 = pFVar15->tracks;
                uVar20 = pFVar15->sound->tracks[uVar29].events[uVar32].field_3.wave.position;
              }
              pFVar16[uVar27].events[uVar32].loopCount = uVar20;
            }
            else {
              pFVar33 = pFVar33 + uVar32;
              pFVar17 = pFVar15->tracks[uVar27].events + uVar32;
              pFVar17->loopCount =
                   (ushort)pFVar15->sound->tracks[uVar29].events[uVar32].field_3.wave.loopCount;
              uVar19 = 0;
              if (((pFVar33->field_3).wave.isComplex != '\0') &&
                 ((undefined1  [72])((undefined1  [72])pFVar33->field_3 & (undefined1  [72])0xf) !=
                  (undefined1  [72])0x0)) {
                uVar19 = (ulong)*(ushort *)((long)&pFVar33->field_3 + 10);
                if (uVar19 == 0) {
                  local_3c = 0.0;
                }
                else {
                  local_3c = 0.0;
                  uVar25 = 0;
                  do {
                    local_3c = local_3c +
                               (float)*(byte *)(*(long *)((long)&pFVar33->field_3 + 0x20) + uVar25);
                    uVar25 = uVar25 + 1;
                  } while (uVar19 != uVar25);
                }
                uVar13 = stb_rand();
                local_40 = (float)((double)uVar13 * 2.3283064365386963e-10) * local_3c;
                uVar19 = (ulong)*(ushort *)((long)&pFVar33->field_3 + 10);
                fVar34 = local_3c;
                do {
                  if ((long)uVar19 < 1) goto LAB_0010e3a6;
                  pbVar3 = (byte *)(*(long *)((long)&pFVar33->field_3 + 0x20) + -1 + uVar19);
                  uVar19 = uVar19 - 1;
                  fVar34 = fVar34 - (float)*pbVar3;
                } while (local_40 <= fVar34);
              }
              (pFVar17->field_3).valuei = (uint32_t)uVar19;
LAB_0010e3a6:
              FACT_INTERNAL_GetNextWave
                        (cue,pFVar15->sound,pFVar15->sound->tracks + uVar29,pFVar15->tracks + uVar27
                         ,pFVar33,pFVar17);
              pFVar16 = pFVar15->tracks;
              pFVar16[uVar27].waveEvt = pFVar33;
              pFVar16[uVar27].waveEvtInst = pFVar17;
            }
          }
LAB_0010e3d5:
          uVar32 = uVar32 + 1;
          pFVar18 = pFVar15->sound->tracks;
        } while (uVar32 < pFVar18[uVar29].eventCount);
      }
      uVar27 = local_38 + 1;
      pFVar30 = pFVar15->sound;
    } while (uVar27 < pFVar30->trackCount);
  }
  cue->maxRpcReleaseTime = 0;
  if (pFVar15->sound->trackCount != '\0') {
    uVar27 = 0;
    do {
      pFVar18 = pFVar15->sound->tracks;
      if (pFVar18[uVar27].rpcCodeCount != '\0') {
        uVar29 = 0;
        do {
          pFVar6 = pFVar15->parentCue->parentBank->parentEngine;
          if (pFVar6->rpcCount != 0) {
            puVar24 = pFVar6->rpcCodes;
            lVar28 = 0;
            do {
              if (*puVar24 == pFVar18[uVar27].rpcCodes[uVar29]) {
                puVar26 = (ushort *)((long)pFVar6->rpcs - lVar28);
                goto LAB_0010e485;
              }
              lVar28 = lVar28 + -0x10;
              puVar24 = puVar24 + 1;
            } while ((ulong)pFVar6->rpcCount * 0x10 + lVar28 != 0);
          }
          puVar26 = (ushort *)0x0;
LAB_0010e485:
          if ((((puVar26[2] == 0) &&
               ((cue->parentBank->parentEngine->variables[*puVar26].accessibility & 4) != 0)) &&
              (iVar14 = SDL_strcmp(pFVar6->variableNames[*puVar26],"ReleaseTime"), iVar14 == 0)) &&
             (fVar34 = *(float *)(*(long *)(puVar26 + 4) + -0xc + (ulong)(byte)puVar26[1] * 0xc),
             (float)cue->maxRpcReleaseTime < fVar34)) {
            cue->maxRpcReleaseTime = (uint32_t)(long)fVar34;
          }
          uVar29 = uVar29 + 1;
          pFVar18 = pFVar15->sound->tracks;
        } while (uVar29 < pFVar18[uVar27].rpcCodeCount);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < pFVar15->sound->trackCount);
  }
  cue->playingSound = pFVar15;
  return '\x01';
}

Assistant:

uint8_t FACT_INTERNAL_CreateSound(FACTCue *cue, uint16_t fadeInMS)
{
	int32_t i, j, k;
	float max, next, weight;
	const char *wbName;
	FACTWaveBank *wb = NULL;
	LinkedList *list;
	FACTEvent *evt;
	FACTEventInstance *evtInst;
	FACTSound *baseSound = NULL;
	FACTSoundInstance *newSound;
	FACTRPC *rpc;
	float lastX;

	union
	{
		float maxf;
		uint8_t maxi;
	} limitmax;
	FACTCue *tmp, *wnr;
	uint16_t categoryIndex;
	FACTAudioCategory *category;

	if (cue->data->flags & 0x04)
	{
		/* Sound */
		baseSound = cue->sound;
	}
	else
	{
		/* Variation */
		if (cue->variation->flags == 3)
		{
			/* Interactive */
			if (cue->parentBank->parentEngine->variables[cue->variation->variable].accessibility & 0x04)
			{
				FACTCue_GetVariable(
					cue,
					cue->variation->variable,
					&next
				);
			}
			else
			{
				FACTAudioEngine_GetGlobalVariable(
					cue->parentBank->parentEngine,
					cue->variation->variable,
					&next
				);
			}
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				if (	next <= cue->variation->entries[i].maxWeight &&
					next >= cue->variation->entries[i].minWeight	)
				{
					break;
				}
			}

			/* This should only happen when the user control
			 * variable is none of the sound probabilities, in
			 * which case we are just silent. But, we should still
			 * claim to be "playing" in the meantime.
			 */
			if (i == cue->variation->entryCount)
			{
				return 1;
			}
		}
		else
		{
			/* Random */
			max = 0.0f;
			for (i = 0; i < cue->variation->entryCount; i += 1)
			{
				max += (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
			}
			next = FACT_INTERNAL_rng() * max;

			/* Use > 0, not >= 0. If we hit 0, that's it! */
			for (i = cue->variation->entryCount - 1; i > 0; i -= 1)
			{
				weight = (
					cue->variation->entries[i].maxWeight -
					cue->variation->entries[i].minWeight
				);
				if (next > (max - weight))
				{
					break;
				}
				max -= weight;
			}
		}

		if (cue->variation->isComplex)
		{
			/* Grab the Sound via the code. FIXME: Do this at load time? */
			for (j = 0; j < cue->parentBank->soundCount; j += 1)
			{
				if (cue->variation->entries[i].soundCode == cue->parentBank->soundCodes[j])
				{
					baseSound = &cue->parentBank->sounds[j];
					break;
				}
			}
		}
		else
		{
			/* Pull in the WaveBank... */
			wbName = cue->parentBank->wavebankNames[
				cue->variation->entries[i].simple.wavebank
			];
			list = cue->parentBank->parentEngine->wbList;
			while (list != NULL)
			{
				wb = (FACTWaveBank*) list->entry;
				if (FAudio_strcmp(wbName, wb->name) == 0)
				{
					break;
				}
				list = list->next;
			}
			FAudio_assert(wb != NULL);

			/* Generate the wave... */
			FACTWaveBank_Prepare(
				wb,
				cue->variation->entries[i].simple.track,
				0,
				0,
				0,
				&cue->simpleWave
			);
			cue->simpleWave->parentCue = cue;
		}
	}

	/* Alloc SoundInstance variables */
	if (baseSound != NULL)
	{
		/* Category Instance Limits */
		categoryIndex = baseSound->category;
		if (categoryIndex != FACTCATEGORY_INVALID)
		{
			category = &cue->parentBank->parentEngine->categories[categoryIndex];
			if (category->instanceCount >= category->instanceLimit)
			{
				wnr = NULL;
				tmp = cue->parentBank->cueList;
				if (category->maxInstanceBehavior == 0) /* Fail */
				{
					cue->state |= FACT_STATE_STOPPED;
					cue->state &= ~(
						FACT_STATE_PLAYING |
						FACT_STATE_STOPPING |
						FACT_STATE_PAUSED
					);
					return 0;
				}
				else if (category->maxInstanceBehavior == 1) /* Queue */
				{
					/* FIXME: How is this different from Replace Oldest? */
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 2) /* Replace Oldest */
				{
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							break;
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 3) /* Replace Quietest */
				{
					limitmax.maxf = FACTVOLUME_MAX;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							/*FIXME: tmp->playingSound->volume < limitmax.maxf &&*/
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							/* limitmax.maxf = tmp->playingSound->volume; */
						}
						tmp = tmp->next;
					}
				}
				else if (category->maxInstanceBehavior == 4) /* Replace Lowest Priority */
				{
					limitmax.maxi = 0xFF;
					while (tmp != NULL)
					{
						if (	tmp != cue &&
							tmp->playingSound != NULL &&
							tmp->playingSound->sound->category == categoryIndex &&
							tmp->playingSound->sound->priority < limitmax.maxi &&
							!(tmp->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))	)
						{
							wnr = tmp;
							limitmax.maxi = tmp->playingSound->sound->priority;
						}
						tmp = tmp->next;
					}
				}
				if (wnr != NULL)
				{
					fadeInMS = category->fadeInMS;
					if (wnr->playingSound != NULL)
					{
						FACT_INTERNAL_BeginFadeOut(wnr->playingSound, category->fadeOutMS);
					}
					else
					{
						FACTCue_Stop(wnr, 0);
					}
				}
			}
			category->instanceCount += 1;
		}

		newSound = (FACTSoundInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTSoundInstance)
		);
		newSound->parentCue = cue;
		newSound->sound = baseSound;
		newSound->rpcData.rpcVolume = 0.0f;
		newSound->rpcData.rpcPitch = 0.0f;
		newSound->rpcData.rpcReverbSend = 0.0f;
		newSound->rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
		newSound->rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;
		newSound->fadeType = (fadeInMS > 0);
		if (newSound->fadeType)
		{
			newSound->fadeStart = FAudio_timems();
			newSound->fadeTarget = fadeInMS;
		}
		else
		{
			newSound->fadeStart = 0;
			newSound->fadeTarget = 0;
		}
		newSound->tracks = (FACTTrackInstance*) cue->parentBank->parentEngine->pMalloc(
			sizeof(FACTTrackInstance) * newSound->sound->trackCount
		);
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			newSound->tracks[i].rpcData.rpcVolume = 0.0f;
			newSound->tracks[i].rpcData.rpcPitch = 0.0f;
			newSound->tracks[i].rpcData.rpcReverbSend = 0.0f;
			newSound->tracks[i].rpcData.rpcFilterQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].rpcData.rpcFilterFreq = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].evtVolume = 0.0f;
			newSound->tracks[i].evtPitch = 0.0f;

			newSound->tracks[i].activeWave.wave = NULL;
			newSound->tracks[i].activeWave.baseVolume = 0.0f;
			newSound->tracks[i].activeWave.basePitch = 0;
			newSound->tracks[i].activeWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].activeWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			newSound->tracks[i].upcomingWave.wave = NULL;
			newSound->tracks[i].upcomingWave.baseVolume = 0.0f;
			newSound->tracks[i].upcomingWave.basePitch = 0;
			newSound->tracks[i].upcomingWave.baseQFactor = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			newSound->tracks[i].upcomingWave.baseFrequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;

			newSound->tracks[i].events = (FACTEventInstance*) cue->parentBank->parentEngine->pMalloc(
				sizeof(FACTEventInstance) * newSound->sound->tracks[i].eventCount
			);
			for (j = 0; j < newSound->sound->tracks[i].eventCount; j += 1)
			{
				evt = &newSound->sound->tracks[i].events[j];

				newSound->tracks[i].events[j].timestamp =
					newSound->sound->tracks[i].events[j].timestamp;
				newSound->tracks[i].events[j].loopCount = 0;
				newSound->tracks[i].events[j].finished = 0;
				newSound->tracks[i].events[j].value = 0.0f;

				if (	evt->type == FACTEVENT_PLAYWAVE ||
					evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
					evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
					evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].wave.loopCount;

					evtInst = &newSound->tracks[i].events[j];
					if (	!evt->wave.isComplex ||
						(evt->wave.complex.variation & 0xF) == 0	)
					{
						evtInst->valuei = 0;
					}
					else
					{
						max = 0.0f;
						for (k = 0; k < evt->wave.complex.trackCount; k += 1)
						{
							max += evt->wave.complex.weights[k];
						}
						next = FACT_INTERNAL_rng() * max;
						for (k = evt->wave.complex.trackCount - 1; k >= 0; k -= 1)
						{
							if (next > (max - evt->wave.complex.weights[k]))
							{
								evtInst->valuei = k;
								break;
							}
							max -= evt->wave.complex.weights[k];
						}
					}
					FACT_INTERNAL_GetNextWave(
						cue,
						newSound->sound,
						&newSound->sound->tracks[i],
						&newSound->tracks[i],
						evt,
						evtInst
					);
					newSound->tracks[i].waveEvt = evt;
					newSound->tracks[i].waveEvtInst = evtInst;
				}
				else if (	evt->type == FACTEVENT_PITCHREPEATING ||
						evt->type == FACTEVENT_VOLUMEREPEATING	)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].value.repeats;
				}
				else if (evt->type == FACTEVENT_MARKERREPEATING)
				{
					newSound->tracks[i].events[j].loopCount =
						newSound->sound->tracks[i].events[j].marker.repeats;
				}
			}
		}

		/* Calculate Max RPC Release Time */
		cue->maxRpcReleaseTime = 0;
		for (i = 0; i < newSound->sound->trackCount; i += 1)
		{
			for (j = 0; j < newSound->sound->tracks[i].rpcCodeCount; j += 1)
			{
				rpc = FACT_INTERNAL_GetRPC(
					newSound->parentCue->parentBank->parentEngine,
					newSound->sound->tracks[i].rpcCodes[j]
				);
				if (	rpc->parameter == RPC_PARAMETER_VOLUME &&
					cue->parentBank->parentEngine->variables[rpc->variable].accessibility & 0x04	)
				{
					if (FAudio_strcmp(
						newSound->parentCue->parentBank->parentEngine->variableNames[rpc->variable],
						"ReleaseTime"
					) == 0) {
						lastX = rpc->points[rpc->pointCount - 1].x;
						if (lastX > cue->maxRpcReleaseTime)
						{
							cue->maxRpcReleaseTime = (uint32_t) lastX /* bleh */;
						}
					}
				}
			}
		}

		cue->playingSound = newSound;
	}

	return 1;
}